

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O0

string * wallet::DecodeDumpString(string *str)

{
  char cVar1;
  char cVar2;
  char cVar3;
  size_type sVar4;
  byte *pbVar5;
  const_reference pvVar6;
  string *in_RDI;
  long in_FS_OFFSET;
  uchar c;
  uint pos;
  stringstream ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  size_type in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  byte local_1a5;
  uint local_1a4;
  stringstream local_190 [16];
  ostream local_180 [376];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::stringstream::stringstream(local_190);
  local_1a4 = 0;
  while( true ) {
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (in_stack_fffffffffffffe08);
    if (sVar4 <= local_1a4) break;
    pbVar5 = (byte *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                                  in_stack_fffffffffffffe10);
    local_1a5 = *pbVar5;
    if (local_1a5 == 0x25) {
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length(in_stack_fffffffffffffe08);
      if (local_1a4 + 2 < sVar4) {
        pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                            in_stack_fffffffffffffe10);
        in_stack_fffffffffffffe1c = ((int)*pvVar6 >> 6) * 9;
        pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                            in_stack_fffffffffffffe10);
        cVar1 = *pvVar6;
        cVar3 = (char)in_stack_fffffffffffffe1c;
        pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                            in_stack_fffffffffffffe10);
        cVar2 = *pvVar6;
        pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                            in_stack_fffffffffffffe10);
        local_1a5 = (cVar3 + (cVar1 - 0x30U & 0xf)) * '\x10' |
                    (cVar2 >> 6) * '\t' + (*pvVar6 - 0x30U & 0xf);
        local_1a4 = local_1a4 + 2;
      }
    }
    std::operator<<(local_180,local_1a5);
    local_1a4 = local_1a4 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_190);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::string DecodeDumpString(const std::string &str) {
    std::stringstream ret;
    for (unsigned int pos = 0; pos < str.length(); pos++) {
        unsigned char c = str[pos];
        if (c == '%' && pos+2 < str.length()) {
            c = (((str[pos+1]>>6)*9+((str[pos+1]-'0')&15)) << 4) |
                ((str[pos+2]>>6)*9+((str[pos+2]-'0')&15));
            pos += 2;
        }
        ret << c;
    }
    return ret.str();
}